

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportjsonext.cpp
# Opt level: O0

void __thiscall trun::ResultsReportJSONExtensive::DumpNewStruct(ResultsReportJSONExtensive *this)

{
  initializer_list<std::pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  bool bVar1;
  int iVar2;
  ResultSummary *pRVar3;
  vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
  *__x;
  vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_> *__x_00
  ;
  reference psVar4;
  pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_160;
  undefined1 local_138 [8];
  shared_ptr<trun::TestFunc> testFunction;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
  *__range1;
  bool bNeedComma;
  pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppStack_108;
  pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  iterator local_60;
  _Alloc_hider local_58;
  undefined1 local_40 [8];
  vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
  testFunctions;
  vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
  results;
  ResultsReportJSONExtensive *this_local;
  
  if (((((this->super_ResultsReportJSON).bHadFailures & 1U) != 0) ||
      (((this->super_ResultsReportJSON).bHadSummary & 1U) != 0)) ||
     (((this->super_ResultsReportJSON).bHadSuccess & 1U) != 0)) {
    ResultsReportPinterBase::WriteNoIndent((ResultsReportPinterBase *)this,",\n");
  }
  pRVar3 = ResultSummary::Instance();
  __x = ResultSummary::Results(pRVar3);
  std::
  vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>::
  vector((vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
          *)&testFunctions.
             super__Vector_base<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,__x);
  pRVar3 = ResultSummary::Instance();
  __x_00 = ResultSummary::TestFunctions(pRVar3);
  std::vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>::
  vector((vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
          *)local_40,__x_00);
  if (DumpNewStruct()::resultToName_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&DumpNewStruct()::resultToName_abi_cxx11_);
    if (iVar2 != 0) {
      ppStack_108 = &local_100;
      __range1._7_1_ = 0;
      std::
      pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<trun::kTestResult,_const_char_(&)[5],_true>
                (ppStack_108,(anon_enum_8 *)((long)&__range1 + 7),(char (*) [5])0x33b3fb);
      ppStack_108 = &local_d8;
      __range1._6_1_ = 3;
      std::
      pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<trun::kTestResult,_const_char_(&)[8],_true>
                (ppStack_108,(anon_enum_8 *)((long)&__range1 + 6),(char (*) [8])"AllFail");
      ppStack_108 = &local_b0;
      __range1._5_1_ = 2;
      std::
      pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<trun::kTestResult,_const_char_(&)[11],_true>
                (ppStack_108,(anon_enum_8 *)((long)&__range1 + 5),(char (*) [11])"ModuleFail");
      ppStack_108 = &local_88;
      __range1._4_1_ = 1;
      std::
      pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<trun::kTestResult,_const_char_(&)[9],_true>
                (ppStack_108,(anon_enum_8 *)((long)&__range1 + 4),(char (*) [9])"TestFail");
      local_60 = &local_100;
      local_58._M_p = (pointer)0x4;
      std::
      allocator<std::pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::allocator((allocator<std::pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&__range1 + 2));
      __l._M_len = (size_type)local_58._M_p;
      __l._M_array = local_60;
      std::
      map<trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<trun::kTestResult>,_std::allocator<std::pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map(&DumpNewStruct()::resultToName_abi_cxx11_,__l,
            (less<trun::kTestResult> *)((long)&__range1 + 3),
            (allocator<std::pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&__range1 + 2));
      std::
      allocator<std::pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~allocator((allocator<std::pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&__range1 + 2));
      local_160 = (pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60;
      do {
        local_160 = local_160 + -1;
        std::
        pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(local_160);
      } while (local_160 != &local_100);
      __cxa_atexit(std::
                   map<trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<trun::kTestResult>,_std::allocator<std::pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~map,&DumpNewStruct()::resultToName_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&DumpNewStruct()::resultToName_abi_cxx11_);
    }
  }
  ResultsReportPinterBase::WriteLine((ResultsReportPinterBase *)this,"\"Results\" : [");
  ResultsReportPinterBase::PushIndent((ResultsReportPinterBase *)this);
  __range1._1_1_ = 0;
  __end1 = std::
           vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
           ::begin((vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
                    *)local_40);
  testFunction.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>::
       end((vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
            *)local_40);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::shared_ptr<trun::TestFunc>_*,_std::vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>_>
                      (&__end1,(__normal_iterator<std::shared_ptr<trun::TestFunc>_*,_std::vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>_>
                                *)&testFunction.
                                   super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    psVar4 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<trun::TestFunc>_*,_std::vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>_>
             ::operator*(&__end1);
    std::shared_ptr<trun::TestFunc>::shared_ptr((shared_ptr<trun::TestFunc> *)local_138,psVar4);
    if ((__range1._1_1_ & 1) != 0) {
      ResultsReportPinterBase::WriteNoIndent((ResultsReportPinterBase *)this,",\n");
    }
    PrintFuncResult(this,(Ref *)local_138);
    __range1._1_1_ = 1;
    std::shared_ptr<trun::TestFunc>::~shared_ptr((shared_ptr<trun::TestFunc> *)local_138);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<trun::TestFunc>_*,_std::vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>_>
    ::operator++(&__end1);
  }
  ResultsReportPinterBase::PopIndent((ResultsReportPinterBase *)this);
  ResultsReportPinterBase::WriteLine((ResultsReportPinterBase *)this,"");
  ResultsReportPinterBase::Write((ResultsReportPinterBase *)this,"]");
  std::vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>::
  ~vector((vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
           *)local_40);
  std::
  vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>::
  ~vector((vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
           *)&testFunctions.
              super__Vector_base<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void ResultsReportJSONExtensive::DumpNewStruct() {

    if (bHadFailures || bHadSummary || bHadSuccess) {
        WriteNoIndent(",\n");
    }

    auto results = ResultSummary::Instance().Results();
    auto testFunctions = ResultSummary::Instance().TestFunctions();

    static std::map<kTestResult, std::string> resultToName={
            {kTestResult_Pass, "Pass"},
            {kTestResult_AllFail, "AllFail"},
            {kTestResult_ModuleFail,"ModuleFail"},
            {kTestResult_TestFail, "TestFail"},
    };

    WriteLine(R"("Results" : [)");
    PushIndent();

    bool bNeedComma = false;
    for (auto testFunction : testFunctions) {
        if (bNeedComma) {
            WriteNoIndent(",\n");
        }
        PrintFuncResult(testFunction);
        bNeedComma = true;
    }
    PopIndent();
    WriteLine("");
    Write("]");
}